

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall slang::ast::SystemTimingCheckSymbol::resolve(SystemTimingCheckSymbol *this)

{
  SyntaxNode **ppSVar1;
  SyntaxKind SVar2;
  Scope *pSVar3;
  SyntaxNode *pSVar4;
  Scope *parentParent;
  SystemTimingCheckDef *pSVar5;
  SyntaxNode *pSVar6;
  Type *pTVar7;
  real_t rVar8;
  Symbol *pSVar9;
  bool bVar10;
  int iVar11;
  Diagnostic *pDVar12;
  SyntaxNode *pSVar13;
  undefined4 extraout_var;
  EdgeDescriptorSyntax *pEVar14;
  size_t __n;
  size_t __n_00;
  ulong uVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SourceLocation SVar16;
  Expression *pEVar17;
  undefined4 extraout_var_02;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar18;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *pEVar19;
  ParentList *pPVar20;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  size_t extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  size_t extraout_RDX_15;
  pointer pSVar21;
  DiagCode code;
  size_t index;
  Compilation *dst;
  shortreal_t sVar22;
  LookupLocation LVar23;
  SourceRange SVar24;
  string_view sVar25;
  string_view sVar26;
  EdgeDescriptor desc;
  iterator __begin6;
  EdgeKind edge;
  ASTContext context;
  SmallVector<std::array<char,_2UL>,_20UL> edgeDescriptors;
  Expression *condition;
  Token *local_c0;
  Expression *local_b8;
  SystemTimingCheckDef *local_b0;
  SyntaxNode *local_a8;
  ulong local_a0;
  SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> argBuf;
  
  this->isResolved = true;
  if (this->def != (SystemTimingCheckDef *)0x0) {
    pSVar3 = (this->super_Symbol).parentScope;
    pSVar4 = (this->super_Symbol).originatingSyntax;
    dst = pSVar3->compilation;
    parentParent = pSVar3->thisSym->parentScope;
    LVar23 = LookupLocation::after(&this->super_Symbol);
    context.lookupIndex = LVar23.index;
    context.flags.m_bits = 0x400000020;
    context.instanceOrProc = (Symbol *)0x0;
    context.firstTempVar = (TempVarSymbol *)0x0;
    context.randomizeDetails = (RandomizeDetails *)0x0;
    context.assertionInstance = (AssertionInstanceDetails *)0x0;
    pSVar5 = this->def;
    pSVar13 = pSVar4[6].previewNode;
    pEVar19 = (EVP_PKEY_CTX *)((ulong)((long)&pSVar13->kind + 1U) >> 1);
    context.scope.ptr = pSVar3;
    if (pEVar19 < (EVP_PKEY_CTX *)pSVar5->minArgs) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
      pDVar12 = ASTContext::addDiag(&context,(DiagCode)0x9f0007,SVar24);
      sVar25 = parsing::Token::valueText((Token *)&pSVar4[3].parent);
      Diagnostic::operator<<(pDVar12,sVar25);
      pDVar12 = Diagnostic::operator<<<unsigned_long>(pDVar12,this->def->minArgs);
      pSVar4 = pSVar4[6].previewNode;
    }
    else {
      src = (EVP_PKEY_CTX *)
            ((long)(pSVar5->args).
                   super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar5->args).
                   super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (pEVar19 <= src) {
        argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.data_ =
             (pointer)argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.
                      firstElement;
        argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.len = 0;
        argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.cap = 2;
        local_c0 = (Token *)&pSVar4[3].parent;
        index = 0;
        local_b0 = pSVar5;
        local_a8 = pSVar4;
        do {
          if ((ulong)((long)&pSVar13->kind + 1) >> 1 <= index) {
            iVar11 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
                               (&argBuf.
                                 super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                                (EVP_PKEY_CTX *)dst,src);
            (this->args)._M_ptr = (pointer)CONCAT44(extraout_var_03,iVar11);
            (this->args)._M_extent._M_extent_value = extraout_RDX_15;
            SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::cleanup
                      (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                       (EVP_PKEY_CTX *)dst);
            return;
          }
          pSVar21 = (local_b0->args).
                    super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                    ._M_impl.super__Vector_impl_data._M_start + index;
          pSVar13 = &slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::
                     operator[]((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                                &pSVar4[4].previewNode,index)->super_SyntaxNode;
          pSVar9 = context.instanceOrProc;
          SVar2 = pSVar13->kind;
          if (SVar2 == TimingCheckEventArg) {
            if (pSVar21->kind == Event) {
LAB_003aa22c:
              local_b8 = bindTerminal(*(ExpressionSyntax **)(pSVar13 + 2),Both,parentParent,&context
                                     );
              condition = (Expression *)0x0;
              if (pSVar13[2].parent != (SyntaxNode *)0x0) {
                iVar11 = Expression::bind((int)pSVar13[2].parent[1].previewNode,(sockaddr *)&context
                                          ,0);
                condition = (Expression *)CONCAT44(extraout_var,iVar11);
                ASTContext::requireBooleanConvertible(&context,condition);
              }
              edge = SemanticFacts::getEdgeKind((TokenKind)pSVar13[1].kind);
              edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.len = 0;
              edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.data_ =
                   (pointer)edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.
                            firstElement;
              edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.cap = 0x14;
              pSVar6 = pSVar13[1].previewNode;
              pEVar19 = extraout_RDX_02;
              if (pSVar6 != (SyntaxNode *)0x0) {
                ppSVar1 = &pSVar6[1].previewNode;
                __begin6.index = 0;
                __begin6.list = (ParentList *)ppSVar1;
                local_a0 = (ulong)((long)&(pSVar6[3].previewNode)->kind + 1) >> 1;
                uVar15 = 0;
                pPVar20 = (ParentList *)ppSVar1;
                while ((pPVar20 != (ParentList *)ppSVar1 || (uVar15 != local_a0))) {
                  pEVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>
                            ::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>::dereference
                                      (&__begin6);
                  sVar25 = parsing::Token::rawText(&pEVar14->t1);
                  __n = sVar25._M_len;
                  sVar26 = parsing::Token::rawText(&pEVar14->t2);
                  pEVar19 = (EVP_PKEY_CTX *)sVar26._M_str;
                  __n_00 = sVar26._M_len;
                  if (__n_00 + __n == 2) {
                    memcpy(&desc,sVar25._M_str,__n);
                    if (__n_00 != 0) {
                      memcpy(desc._M_elems + __n,pEVar19,__n_00);
                    }
                    SmallVectorBase<std::array<char,2ul>>::emplace_back<std::array<char,2ul>const&>
                              ((SmallVectorBase<std::array<char,2ul>> *)&edgeDescriptors,&desc);
                    pEVar19 = extraout_RDX_03;
                  }
                  uVar15 = __begin6.index + 1;
                  __begin6.index = uVar15;
                  pPVar20 = __begin6.list;
                }
              }
              __begin6.list._0_4_ =
                   SmallVectorBase<std::array<char,_2UL>_>::copy
                             (&edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>,
                              (EVP_PKEY_CTX *)dst,pEVar19);
              __begin6.list._4_4_ = extraout_var_00;
              __begin6.index = extraout_RDX_04;
              pEVar17 = local_b8;
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
              emplace_back<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
                        (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                         local_b8,&condition,&edge,
                         (span<std::array<char,_2UL>,_18446744073709551615UL> *)&__begin6);
              SmallVectorBase<std::array<char,_2UL>_>::cleanup
                        (&edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>,
                         (EVP_PKEY_CTX *)pEVar17);
              src = extraout_RDX_05;
LAB_003aa3de:
              if (pSVar21->requireEdge == true) {
                src = (EVP_PKEY_CTX *)
                      (argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.len *
                      0x28);
                if ((argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.data_ +
                    -1)[argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.len].
                    expr != (Expression *)0x0) {
                  if ((argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.data_
                      + argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.len)
                      [-1].edge == None) {
                    pDVar12 = ASTContext::addDiag(&context,(DiagCode)0xc50006,
                                                  ((argBuf.
                                                  super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>
                                                  .data_ + -1)
                                                  [argBuf.
                                                  super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>
                                                  .len].expr)->sourceRange);
                    sVar25 = parsing::Token::valueText(local_c0);
                    Diagnostic::operator<<(pDVar12,sVar25);
                    src = extraout_RDX_12;
                  }
                  else if (((argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.
                             data_ + argBuf.
                                     super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>
                                     .len)[-1].edge == BothEdges) && (this->def->kind == NoChange))
                  {
                    SVar24 = parsing::Token::range((Token *)(pSVar13 + 1));
                    ASTContext::addDiag(&context,(DiagCode)0x8a0006,SVar24);
                    src = extraout_RDX_06;
                  }
                }
              }
              goto switchD_003aa1e7_default;
            }
            SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar13);
            code.subsystem = Declarations;
            code.code = 0xc6;
LAB_003aa192:
            ASTContext::addDiag(&context,code,SVar24);
LAB_003aa19f:
            SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                      (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>);
            src = extraout_RDX_00;
          }
          else {
            if (SVar2 == EmptyTimingCheckArg) {
              if (index < this->def->minArgs) {
                pSVar13 = &slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::
                           operator[]((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                                      &pSVar4[4].previewNode,index)->super_SyntaxNode;
                SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar13);
                code.subsystem = Expressions;
                code.code = 0x4d;
                goto LAB_003aa192;
              }
              goto LAB_003aa19f;
            }
            src = extraout_RDX;
            switch(pSVar21->kind) {
            case Event:
              if (SVar2 != ExpressionTimingCheckArg) goto LAB_003aa22c;
              pEVar17 = bindTerminal(*(ExpressionSyntax **)(pSVar13 + 1),Both,parentParent,&context)
              ;
              if (pEVar17 == (Expression *)0x0) {
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>);
                src = extraout_RDX_14;
              }
              else {
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                           pEVar17);
                src = extraout_RDX_01;
              }
              goto LAB_003aa3de;
            case Notifier:
              pSVar6 = *(SyntaxNode **)(pSVar13 + 1);
              if (pSVar6->kind == IdentifierName) {
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.len._4_4_ =
                     context._12_4_;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.len._0_4_ =
                     context.lookupIndex;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.firstElement[0] =
                     (char)context.instanceOrProc;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.firstElement[1] =
                     context.instanceOrProc._1_1_;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>._26_2_ =
                     context.instanceOrProc._2_2_;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>._28_4_ =
                     context.instanceOrProc._4_4_;
                edgeDescriptors._48_8_ = context.assertionInstance;
                edgeDescriptors._32_8_ = context.firstTempVar;
                edgeDescriptors._40_8_ = context.randomizeDetails;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.data_ =
                     (pointer)context.scope.ptr;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>.cap =
                     context.flags.m_bits & 0x1fffffffffdf;
                pTVar7 = dst->logicType;
                context.instanceOrProc = pSVar9;
                __begin6 = (iterator)slang::syntax::SyntaxNode::getFirstToken(pSVar6);
                SVar16 = parsing::Token::location((Token *)&__begin6);
                pEVar17 = Expression::bindLValue
                                    ((ExpressionSyntax *)pSVar6,pTVar7,SVar16,
                                     (ASTContext *)&edgeDescriptors,false);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                           pEVar17);
                src = extraout_RDX_10;
              }
              else {
                SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar13);
                ASTContext::addDiag(&context,(DiagCode)0x680006,SVar24);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>);
                src = extraout_RDX_11;
              }
              break;
            case DelayedRef:
              if (argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.data_
                  [pSVar21->signalRef].expr == (Expression *)0x0) {
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>);
                src = extraout_RDX_13;
              }
              else {
                pSVar13 = *(SyntaxNode **)(pSVar13 + 1);
                pTVar7 = ((argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>.
                           data_[pSVar21->signalRef].expr)->type).ptr;
                edgeDescriptors.super_SmallVectorBase<std::array<char,_2UL>_>._0_16_ =
                     slang::syntax::SyntaxNode::getFirstToken(pSVar13);
                SVar16 = parsing::Token::location((Token *)&edgeDescriptors);
                pEVar17 = Expression::bindLValue
                                    ((ExpressionSyntax *)pSVar13,pTVar7,SVar16,&context,false);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                           pEVar17);
                src = extraout_RDX_08;
              }
              break;
            case Limit:
              iVar11 = Expression::bind((int)*(undefined8 *)(pSVar13 + 1),(sockaddr *)&context,0);
              pEVar17 = (Expression *)CONCAT44(extraout_var_02,iVar11);
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
              emplace_back<slang::ast::Expression_const&>
                        (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                         pEVar17);
              ASTContext::eval((ConstantValue *)&edgeDescriptors,&context,pEVar17,
                               (bitmask<slang::ast::EvalFlags>)0x0);
              if ((edgeDescriptors._32_1_ != '\0') && (pSVar21->requirePositive == true)) {
                if ((edgeDescriptors._32_1_ == '\x01') &&
                   (pvVar18 = std::
                              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          *)&edgeDescriptors),
                   (pvVar18->super_SVIntStorage).signFlag == true)) {
                  pvVar18 = std::
                            get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                      ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                        *)&edgeDescriptors);
                  bVar10 = SVInt::isNegative(pvVar18);
                  if (!bVar10) goto LAB_003aa594;
                }
                else {
LAB_003aa594:
                  if (edgeDescriptors._32_1_ == '\x02') {
                    rVar8 = ConstantValue::real((ConstantValue *)&edgeDescriptors);
                    if (rVar8.v < 0.0) goto LAB_003aa5d7;
                  }
                  if ((edgeDescriptors._32_1_ != '\x03') ||
                     (sVar22 = ConstantValue::shortReal((ConstantValue *)&edgeDescriptors),
                     0.0 <= sVar22.v)) goto LAB_003aa5fe;
                }
LAB_003aa5d7:
                pDVar12 = ASTContext::addDiag(&context,(DiagCode)0xca0007,pEVar17->sourceRange);
                Diagnostic::operator<<(pDVar12,(ConstantValue *)&edgeDescriptors);
              }
LAB_003aa5fe:
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&edgeDescriptors);
              src = extraout_RDX_09;
              break;
            case Condition:
              iVar11 = Expression::bind((int)*(undefined8 *)(pSVar13 + 1),(sockaddr *)&context,0);
              ASTContext::requireBooleanConvertible
                        (&context,(Expression *)CONCAT44(extraout_var_01,iVar11));
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
              emplace_back<slang::ast::Expression_const&>
                        (&argBuf.super_SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>,
                         (Expression *)CONCAT44(extraout_var_01,iVar11));
              src = extraout_RDX_07;
            }
          }
switchD_003aa1e7_default:
          index = index + 1;
          pSVar13 = local_a8[6].previewNode;
        } while( true );
      }
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
      pDVar12 = ASTContext::addDiag(&context,(DiagCode)0xa00007,SVar24);
      sVar25 = parsing::Token::valueText((Token *)&pSVar4[3].parent);
      Diagnostic::operator<<(pDVar12,sVar25);
      Diagnostic::operator<<<unsigned_long>
                (pDVar12,(long)(pSVar5->args).
                               super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar5->args).
                               super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      pSVar4 = pSVar4[6].previewNode;
    }
    Diagnostic::operator<<<unsigned_long>(pDVar12,(ulong)((long)&pSVar4->kind + 1) >> 1);
  }
  return;
}

Assistant:

void SystemTimingCheckSymbol::resolve() const {
    isResolved = true;
    if (!def)
        return;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<SystemTimingCheckSyntax>();
    auto& actualArgs = syntax.args;
    auto& formalArgs = def->args;

    if (actualArgs.size() < def->minArgs) {
        auto& diag = context.addDiag(diag::TooFewArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << def->minArgs << actualArgs.size();
        return;
    }

    if (actualArgs.size() > formalArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << formalArgs.size();
        diag << actualArgs.size();
        return;
    }

    SmallVector<Arg> argBuf;
    for (size_t i = 0; i < actualArgs.size(); i++) {
        auto& formal = formalArgs[i];
        auto& actual = *actualArgs[i];
        if (actual.kind == SyntaxKind::EmptyTimingCheckArg) {
            if (i < def->minArgs)
                context.addDiag(diag::EmptyArgNotAllowed, actualArgs[i]->sourceRange());
            argBuf.emplace_back();
            continue;
        }

        if (actual.kind == SyntaxKind::TimingCheckEventArg &&
            formal.kind != SystemTimingCheckArgDef::Event) {
            context.addDiag(diag::TimingCheckEventNotAllowed, actual.sourceRange());
            argBuf.emplace_back();
            continue;
        }

        switch (formal.kind) {
            case SystemTimingCheckArgDef::Limit: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                argBuf.emplace_back(expr);

                auto val = context.eval(expr);
                if (val && formal.requirePositive) {
                    if ((val.isInteger() && val.integer().isSigned() &&
                         val.integer().isNegative()) ||
                        (val.isReal() && val.real() < 0.0) ||
                        (val.isShortReal() && val.shortReal() < 0.0f)) {
                        context.addDiag(diag::NegativeTimingLimit, expr.sourceRange) << val;
                    }
                }
                break;
            }
            case SystemTimingCheckArgDef::Condition: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                context.requireBooleanConvertible(expr);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Notifier: {
                // Needs to be a simple identifier, referencing an integral lvalue
                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                if (exprSyntax.kind != SyntaxKind::IdentifierName) {
                    context.addDiag(diag::InvalidTimingCheckNotifierArg, actual.sourceRange());
                    argBuf.emplace_back();
                    break;
                }

                ASTContext nonContinuous = context;
                nonContinuous.flags &= ~ASTFlags::NonProcedural;

                auto& expr = Expression::bindLValue(exprSyntax, comp.getLogicType(),
                                                    exprSyntax.getFirstToken().location(),
                                                    nonContinuous, /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Event:
                if (actual.kind == SyntaxKind::ExpressionTimingCheckArg) {
                    auto expr = bindTerminal(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);
                    if (!expr)
                        argBuf.emplace_back();
                    else
                        argBuf.emplace_back(*expr);
                }
                else {
                    auto& eventArg = actual.as<TimingCheckEventArgSyntax>();
                    auto expr = bindTerminal(*eventArg.terminal,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);

                    const Expression* condition = nullptr;
                    if (eventArg.condition) {
                        condition = &Expression::bind(*eventArg.condition->expr, context);
                        context.requireBooleanConvertible(*condition);
                    }

                    auto edge = SemanticFacts::getEdgeKind(eventArg.edge.kind);

                    SmallVector<EdgeDescriptor> edgeDescriptors;
                    if (eventArg.controlSpecifier) {
                        for (auto descSyntax : eventArg.controlSpecifier->descriptors) {
                            auto t1 = descSyntax->t1.rawText();
                            auto t2 = descSyntax->t2.rawText();
                            if (t1.length() + t2.length() != 2)
                                continue;

                            EdgeDescriptor desc;
                            memcpy(desc.data(), t1.data(), t1.length());
                            if (!t2.empty())
                                memcpy(desc.data() + t1.length(), t2.data(), t2.length());

                            edgeDescriptors.push_back(desc);
                        }
                    }

                    argBuf.emplace_back(*expr, condition, edge, edgeDescriptors.copy(comp));
                }

                if (formal.requireEdge && argBuf.back().expr) {
                    auto edge = argBuf.back().edge;
                    if (edge == EdgeKind::None) {
                        context.addDiag(diag::TimingCheckEventEdgeRequired,
                                        argBuf.back().expr->sourceRange)
                            << syntax.name.valueText();
                    }
                    else if (def->kind == SystemTimingCheckKind::NoChange &&
                             edge == EdgeKind::BothEdges) {
                        context.addDiag(diag::NoChangeEdgeRequired,
                                        actual.as<TimingCheckEventArgSyntax>().edge.range());
                    }
                }
                break;
            case SystemTimingCheckArgDef::DelayedRef: {
                SLANG_ASSERT(formal.signalRef >= 0 && formal.signalRef < int(i));
                auto signalExpr = argBuf[size_t(formal.signalRef)].expr;
                if (!signalExpr) {
                    argBuf.emplace_back();
                    break;
                }

                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                auto& expr = Expression::bindLValue(exprSyntax, *signalExpr->type,
                                                    exprSyntax.getFirstToken().location(), context,
                                                    /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
        }
    }

    args = argBuf.copy(comp);
}